

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Roadmap.cpp
# Opt level: O0

void setPreferredVelocities(RVOSimulator *sim)

{
  RVOSimulator *pRVar1;
  int iVar2;
  size_t sVar3;
  size_type sVar4;
  reference pvVar5;
  Vector2 *pVVar6;
  reference pvVar7;
  reference pvVar8;
  float extraout_XMM0_Da;
  float fVar9;
  float extraout_XMM0_Da_00;
  double dVar10;
  double dVar11;
  bool local_91;
  Vector2 local_88;
  Vector2 local_80;
  Vector2 local_78;
  float local_70;
  float local_6c;
  float dist;
  float angle;
  Vector2 local_60;
  Vector2 local_58;
  Vector2 local_50;
  Vector2 local_48;
  Vector2 local_40;
  Vector2 local_38;
  Vector2 local_30;
  Vector2 local_28;
  int local_20;
  int local_1c;
  int j;
  int minVertex;
  float minDist;
  int i;
  RVOSimulator *sim_local;
  
  _minDist = sim;
  for (minVertex = 0; iVar2 = minVertex, sVar3 = RVO::RVOSimulator::getNumAgents(_minDist),
      iVar2 < (int)sVar3; minVertex = minVertex + 1) {
    j = 0x50061c46;
    local_1c = -1;
    for (local_20 = 0; iVar2 = local_20,
        sVar4 = std::vector<RoadmapVertex,_std::allocator<RoadmapVertex>_>::size(&roadmap),
        pRVar1 = _minDist, iVar2 < (int)sVar4; local_20 = local_20 + 1) {
      pvVar5 = std::vector<RoadmapVertex,_std::allocator<RoadmapVertex>_>::operator[]
                         (&roadmap,(long)local_20);
      pVVar6 = RVO::RVOSimulator::getAgentPosition(_minDist,(long)minVertex);
      local_28 = RVO::Vector2::operator-(&pvVar5->position,pVVar6);
      RVO::abs((int)&local_28);
      pvVar5 = std::vector<RoadmapVertex,_std::allocator<RoadmapVertex>_>::operator[]
                         (&roadmap,(long)local_20);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&goals,(long)minVertex);
      pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&pvVar5->distToGoal,(long)*pvVar7);
      pRVar1 = _minDist;
      local_91 = false;
      if (extraout_XMM0_Da + *pvVar8 < (float)j) {
        pVVar6 = RVO::RVOSimulator::getAgentPosition(_minDist,(long)minVertex);
        pvVar5 = std::vector<RoadmapVertex,_std::allocator<RoadmapVertex>_>::operator[]
                           (&roadmap,(long)local_20);
        fVar9 = RVO::RVOSimulator::getAgentRadius(_minDist,(long)minVertex);
        local_91 = RVO::RVOSimulator::queryVisibility(pRVar1,pVVar6,&pvVar5->position,fVar9);
      }
      if (local_91 != false) {
        pvVar5 = std::vector<RoadmapVertex,_std::allocator<RoadmapVertex>_>::operator[]
                           (&roadmap,(long)local_20);
        pVVar6 = RVO::RVOSimulator::getAgentPosition(_minDist,(long)minVertex);
        local_30 = RVO::Vector2::operator-(&pvVar5->position,pVVar6);
        RVO::abs((int)&local_30);
        pvVar5 = std::vector<RoadmapVertex,_std::allocator<RoadmapVertex>_>::operator[]
                           (&roadmap,(long)local_20);
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&goals,(long)minVertex);
        pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                           (&pvVar5->distToGoal,(long)*pvVar7);
        j = (int)(extraout_XMM0_Da_00 + *pvVar8);
        local_1c = local_20;
      }
    }
    if (local_1c == -1) {
      sVar3 = (size_t)minVertex;
      RVO::Vector2::Vector2(&local_38,0.0,0.0);
      RVO::RVOSimulator::setAgentPrefVelocity(pRVar1,sVar3,&local_38);
    }
    else {
      pvVar5 = std::vector<RoadmapVertex,_std::allocator<RoadmapVertex>_>::operator[]
                         (&roadmap,(long)local_1c);
      pVVar6 = RVO::RVOSimulator::getAgentPosition(_minDist,(long)minVertex);
      local_40 = RVO::Vector2::operator-(&pvVar5->position,pVVar6);
      fVar9 = RVO::absSq(&local_40);
      pRVar1 = _minDist;
      iVar2 = local_1c;
      if ((fVar9 != 0.0) || (NAN(fVar9))) {
        sVar3 = (size_t)minVertex;
        pvVar5 = std::vector<RoadmapVertex,_std::allocator<RoadmapVertex>_>::operator[]
                           (&roadmap,(long)local_1c);
        pVVar6 = RVO::RVOSimulator::getAgentPosition(_minDist,(long)minVertex);
        _dist = RVO::Vector2::operator-(&pvVar5->position,pVVar6);
        local_60 = RVO::normalize((Vector2 *)&dist);
        RVO::RVOSimulator::setAgentPrefVelocity(pRVar1,sVar3,&local_60);
      }
      else {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&goals,(long)minVertex);
        pRVar1 = _minDist;
        if (iVar2 == *pvVar7) {
          sVar3 = (size_t)minVertex;
          RVO::Vector2::Vector2(&local_48);
          RVO::RVOSimulator::setAgentPrefVelocity(pRVar1,sVar3,&local_48);
        }
        else {
          sVar4 = (size_type)minVertex;
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&goals,sVar4);
          pvVar5 = std::vector<RoadmapVertex,_std::allocator<RoadmapVertex>_>::operator[]
                             (&roadmap,(long)*pvVar7);
          pVVar6 = RVO::RVOSimulator::getAgentPosition(_minDist,(long)minVertex);
          local_58 = RVO::Vector2::operator-(&pvVar5->position,pVVar6);
          local_50 = RVO::normalize(&local_58);
          RVO::RVOSimulator::setAgentPrefVelocity(pRVar1,sVar4,&local_50);
        }
      }
    }
    iVar2 = rand();
    local_6c = (((float)iVar2 + (float)iVar2) * 3.1415927) / 2.1474836e+09;
    iVar2 = rand();
    pRVar1 = _minDist;
    local_70 = (float)iVar2 * 0.0001 * 4.656613e-10;
    sVar3 = (size_t)minVertex;
    pVVar6 = RVO::RVOSimulator::getAgentPrefVelocity(_minDist,sVar3);
    fVar9 = local_70;
    dVar10 = std::cos((double)(ulong)(uint)local_6c);
    dVar11 = std::sin((double)(ulong)(uint)local_6c);
    RVO::Vector2::Vector2(&local_88,SUB84(dVar10,0),SUB84(dVar11,0));
    local_80 = RVO::operator*(fVar9,&local_88);
    local_78 = RVO::Vector2::operator+(pVVar6,&local_80);
    RVO::RVOSimulator::setAgentPrefVelocity(pRVar1,sVar3,&local_78);
  }
  return;
}

Assistant:

void setPreferredVelocities(RVO::RVOSimulator *sim)
{
	/*
	 * Set the preferred velocity to be a vector of unit magnitude (speed) in the
	 * direction of the visible roadmap vertex that is on the shortest path to the
	 * goal.
	 */
#ifdef _OPENMP
#pragma omp parallel for
#endif
	for (int i = 0; i < static_cast<int>(sim->getNumAgents()); ++i) {
		float minDist = 9e9f;
		int minVertex = -1;

		for (int j = 0; j < static_cast<int>(roadmap.size()); ++j) {
			if (RVO::abs(roadmap[j].position - sim->getAgentPosition(i)) + roadmap[j].distToGoal[goals[i]] < minDist &&
				sim->queryVisibility(sim->getAgentPosition(i), roadmap[j].position, sim->getAgentRadius(i))) {

				minDist = RVO::abs(roadmap[j].position - sim->getAgentPosition(i)) + roadmap[j].distToGoal[goals[i]];
				minVertex = j;
			}
		}

		if (minVertex == -1) {
			/* No roadmap vertex is visible; should not happen. */
			sim->setAgentPrefVelocity(i, RVO::Vector2(0, 0));
		}
		else {
			if (RVO::absSq(roadmap[minVertex].position -
			               sim->getAgentPosition(i)) == 0.0f) {
				if (minVertex == goals[i]) {
					sim->setAgentPrefVelocity(i, RVO::Vector2());
				}
				else {
					sim->setAgentPrefVelocity(i, RVO::normalize(roadmap[goals[i]].position - sim->getAgentPosition(i)));
				}
			}
			else {
				sim->setAgentPrefVelocity(i, RVO::normalize(roadmap[minVertex].position - sim->getAgentPosition(i)));
			}
		}

		/*
		 * Perturb a little to avoid deadlocks due to perfect symmetry.
		 */
		float angle = std::rand() * 2.0f * M_PI / RAND_MAX;
		float dist = std::rand() * 0.0001f / RAND_MAX;

		sim->setAgentPrefVelocity(i, sim->getAgentPrefVelocity(i) +
		                          dist * RVO::Vector2(std::cos(angle), std::sin(angle)));
	}
}